

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StandardVariableSpecification.cpp
# Opt level: O3

void __thiscall
DIS::StandardVariableSpecification::unmarshal
          (StandardVariableSpecification *this,DataStream *dataStream)

{
  unsigned_short *d;
  pointer pSVar1;
  pointer pSVar2;
  pointer pSVar3;
  ulong uVar4;
  SimulationManagementPduHeader x;
  SimulationManagementPduHeader local_90;
  
  d = &this->_numberOfStandardVariableRecords;
  DataStream::operator>>(dataStream,d);
  pSVar1 = (this->_standardVariables).
           super__Vector_base<DIS::SimulationManagementPduHeader,_std::allocator<DIS::SimulationManagementPduHeader>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pSVar2 = (this->_standardVariables).
           super__Vector_base<DIS::SimulationManagementPduHeader,_std::allocator<DIS::SimulationManagementPduHeader>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pSVar3 = pSVar1;
  if (pSVar2 != pSVar1) {
    do {
      (**pSVar3->_vptr_SimulationManagementPduHeader)(pSVar3);
      pSVar3 = pSVar3 + 1;
    } while (pSVar3 != pSVar2);
    (this->_standardVariables).
    super__Vector_base<DIS::SimulationManagementPduHeader,_std::allocator<DIS::SimulationManagementPduHeader>_>
    ._M_impl.super__Vector_impl_data._M_finish = pSVar1;
  }
  if (*d != 0) {
    uVar4 = 0;
    do {
      SimulationManagementPduHeader::SimulationManagementPduHeader(&local_90);
      SimulationManagementPduHeader::unmarshal(&local_90,dataStream);
      std::
      vector<DIS::SimulationManagementPduHeader,_std::allocator<DIS::SimulationManagementPduHeader>_>
      ::push_back(&this->_standardVariables,&local_90);
      SimulationManagementPduHeader::~SimulationManagementPduHeader(&local_90);
      uVar4 = uVar4 + 1;
    } while (uVar4 < *d);
  }
  return;
}

Assistant:

void StandardVariableSpecification::unmarshal(DataStream& dataStream)
{
    dataStream >> _numberOfStandardVariableRecords;

     _standardVariables.clear();
     for(size_t idx = 0; idx < _numberOfStandardVariableRecords; idx++)
     {
        SimulationManagementPduHeader x;
        x.unmarshal(dataStream);
        _standardVariables.push_back(x);
     }
}